

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O3

void __thiscall helics::tcp::TcpComms::queue_rx_function(TcpComms *this)

{
  _Atomic_word *p_Var1;
  string *address;
  atomic<int> *paVar2;
  undefined8 this_00;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  int __fd;
  milliseconds timeOut;
  string_view message_00;
  string_view message_01;
  LoopHandle contextLoop;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  ActionMessage message;
  undefined1 local_178 [32];
  undefined1 local_158 [16];
  undefined1 local_148 [32];
  undefined1 local_128 [192];
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  ActionMessage *pAVar7;
  
  if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
    do {
      gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
      pop((ActionMessage *)local_128,&this->rxMessageQueue);
      if (((local_128._0_4_ == cmd_protocol_priority) || (local_128._0_4_ == cmd_protocol_big)) ||
         (local_128._0_4_ == cmd_protocol)) {
        if (local_128._4_4_ == 0x5ab) {
          NetworkCommsInterface::loadPortDefinitions
                    (&this->super_NetworkCommsInterface,(ActionMessage *)local_128);
        }
        else if ((local_128._4_4_ == 0x9db) || (local_128._4_4_ == 0x16570bf)) {
          LOCK();
          (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true
          ;
          UNLOCK();
          CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
          ActionMessage::~ActionMessage((ActionMessage *)local_128);
          return;
        }
      }
      ActionMessage::~ActionMessage((ActionMessage *)local_128);
    } while ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0);
  }
  if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
    CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
  }
  else {
    local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_128[0x10] = '\0';
    local_128._0_8_ = (TcpServer *)(local_128 + 0x10);
    gmlc::networking::AsioContextManager::getContextPointer
              ((AsioContextManager *)local_158,(string *)local_128);
    if ((TcpServer *)local_128._0_8_ != (TcpServer *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_,CONCAT71(local_128._17_7_,local_128[0x10]) + 1);
    }
    if ((this->super_NetworkCommsInterface).encrypted == true) {
      gmlc::networking::SocketFactory::SocketFactory
                ((SocketFactory *)local_148,&this->encryption_config,true);
    }
    else {
      local_148._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_148._16_8_ = (pointer)0x0;
    }
    address = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
    timeOut.__r = (rep)local_148;
    gmlc::networking::TcpServer::create
              ((TcpServer *)local_178,(SocketFactory *)timeOut.__r,
               (io_context *)
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_158._0_8_ + 0x40))->
               _vptr__Sp_counted_base,address,
               (uint16_t)
               (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i,
               this->reuse_address,
               (this->super_NetworkCommsInterface).super_CommsInterface.maxMessageSize);
    if (((((atomic<bool> *)(local_178._0_8_ + 0xf0))->_M_base)._M_i & 1U) != 0) {
      do {
        if (((this->super_NetworkCommsInterface).autoPortNumber == true) &&
           (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0)) {
          gmlc::networking::TcpServer::close((TcpServer *)local_178._0_8_,(int)timeOut.__r);
          LOCK();
          paVar2 = &(this->super_NetworkCommsInterface).PortNumber;
          (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
          UNLOCK();
          timeOut.__r = (rep)local_148;
          gmlc::networking::TcpServer::create
                    ((TcpServer *)local_128,(SocketFactory *)local_148,
                     (io_context *)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_158._0_8_ + 0x40))->
                     _vptr__Sp_counted_base,address,
                     (uint16_t)
                     (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i,
                     this->reuse_address,
                     (this->super_NetworkCommsInterface).super_CommsInterface.maxMessageSize);
          uVar3 = local_128._8_8_;
          local_178._0_8_ = local_128._0_8_;
          this_00 = local_178._8_8_;
          local_128._0_8_ = (TcpServer *)0x0;
          local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_178._8_8_ = uVar3;
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
          }
        }
        else {
          message_00._M_str = "retrying tcp bind";
          message_00._M_len = 0x11;
          CommsInterface::logWarning((CommsInterface *)this,message_00);
          local_128._0_8_ = (TcpServer *)0x0;
          local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8f0d180;
          do {
            iVar5 = nanosleep((timespec *)local_128,(timespec *)local_128);
            if (iVar5 != -1) break;
            piVar6 = __errno_location();
          } while (*piVar6 == 4);
          timeOut.__r = (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.
                        __r;
          bVar4 = gmlc::networking::TcpServer::reConnect((TcpServer *)local_178._0_8_,timeOut);
          if (!bVar4) {
            message_01._M_str = "unable to bind to tcp connection socket";
            message_01._M_len = 0x27;
            iVar5 = 0x27;
            CommsInterface::logError((CommsInterface *)this,message_01);
            gmlc::networking::TcpServer::close((TcpServer *)local_178._0_8_,iVar5);
            CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
            goto LAB_002bf54c;
          }
        }
      } while (((((atomic<bool> *)(local_178._0_8_ + 0xf0))->_M_base)._M_i & 1U) != 0);
    }
    gmlc::networking::AsioContextManager::startContextLoop((AsioContextManager *)(local_178 + 0x18))
    ;
    local_48._8_8_ = (_Invoker_type)0x0;
    local_30 = std::
               _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpComms.cpp:177:9)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpComms.cpp:177:9)>
               ::_M_manager;
    local_48._M_unused._M_object = this;
    std::
    function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
    ::operator=((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                 *)(local_178._0_8_ + 0x90),
                (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                 *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
    }
    local_68._8_8_ = (_Invoker_type)0x0;
    local_50 = std::
               _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpComms.cpp:182:9)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpComms.cpp:182:9)>
               ::_M_manager;
    local_68._M_unused._M_object = this;
    std::function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
    ::operator=((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                 *)(local_178._0_8_ + 0xb0),
                (function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                 *)&local_68);
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,3);
    }
    gmlc::networking::TcpServer::start((TcpServer *)local_178._0_8_);
    CommsInterface::setRxStatus((CommsInterface *)this,CONNECTED);
    while( true ) {
      gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
      pop((ActionMessage *)local_128,&this->rxMessageQueue);
      if ((((local_128._0_4_ == cmd_protocol_priority) || (local_128._0_4_ == cmd_protocol_big)) ||
          (local_128._0_4_ == cmd_protocol)) &&
         ((local_128._4_4_ == 0x9db || (local_128._4_4_ == 0x16570bf)))) break;
      ActionMessage::~ActionMessage((ActionMessage *)local_128);
    }
    ActionMessage::~ActionMessage((ActionMessage *)local_128);
    LOCK();
    (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true;
    UNLOCK();
    local_128._0_8_ = (TcpServer *)0x0;
    local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2faf080;
    do {
      pAVar7 = (ActionMessage *)local_128;
      iVar5 = nanosleep((timespec *)local_128,(timespec *)local_128);
      __fd = (int)pAVar7;
      if (iVar5 != -1) break;
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
    gmlc::networking::TcpServer::close((TcpServer *)local_178._0_8_,__fd);
    CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
    std::
    unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
    ::~unique_ptr((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                   *)(local_178 + 0x18));
LAB_002bf54c:
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)(local_148._8_8_ + 0xc);
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = *(_Atomic_word *)(local_148._8_8_ + 0xc);
        *(int *)(local_148._8_8_ + 0xc) = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (**(code **)(*(long *)local_148._8_8_ + 0x18))();
      }
    }
    if ((element_type *)local_158._8_8_ != (element_type *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
    }
  }
  return;
}

Assistant:

void TcpComms::queue_rx_function()
{
    while (PortNumber < 0) {
        auto message = rxMessageQueue.pop();
        if (isProtocolCommand(message)) {
            switch (message.messageID) {
                case PORT_DEFINITIONS: {
                    loadPortDefinitions(message);
                }

                break;
                case CLOSE_RECEIVER:
                case DISCONNECT:
                    disconnecting = true;
                    setRxStatus(ConnectionStatus::TERMINATED);
                    return;
            }
        }
    }
    if (PortNumber < 0) {
        setRxStatus(ConnectionStatus::ERRORED);
        return;
    }
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    auto sf = encrypted ? gmlc::networking::SocketFactory(encryption_config) :
                          gmlc::networking::SocketFactory();
    auto server = gmlc::networking::TcpServer::create(sf,
                                                      ioctx->getBaseContext(),
                                                      localTargetAddress,
                                                      static_cast<uint16_t>(PortNumber.load()),
                                                      reuse_address,
                                                      maxMessageSize);
    while (!server->isReady()) {
        if ((autoPortNumber) && (hasBroker)) {  // If we failed and we are on an automatically
                                                // assigned port number, just try a different port
            server->close();
            ++PortNumber;
            server = gmlc::networking::TcpServer::create(sf,
                                                         ioctx->getBaseContext(),
                                                         localTargetAddress,
                                                         static_cast<uint16_t>(PortNumber),
                                                         reuse_address,
                                                         maxMessageSize);
        } else {
            logWarning("retrying tcp bind");
            std::this_thread::sleep_for(std::chrono::milliseconds(150));
            auto connected = server->reConnect(connectionTimeout);
            if (!connected) {
                logError("unable to bind to tcp connection socket");
                server->close();
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
    }
    auto contextLoop = ioctx->startContextLoop();
    server->setDataCall(
        [this](const TcpConnection::pointer& connection, const char* data, size_t datasize) {
            return dataReceive(connection.get(), data, datasize);
        });
    CommsInterface* ci = this;
    server->setErrorCall(
        [ci](const TcpConnection::pointer& connection, const std::error_code& error) {
            return commErrorHandler(ci, connection.get(), error);
        });
    server->start();
    setRxStatus(ConnectionStatus::CONNECTED);
    bool loopRunning = true;
    while (loopRunning) {
        auto message = rxMessageQueue.pop();
        if (isProtocolCommand(message)) {
            switch (message.messageID) {
                case CLOSE_RECEIVER:
                case DISCONNECT:
                    loopRunning = false;
                    break;
            }
        }
    }

    disconnecting = true;
    std::this_thread::sleep_for(std::chrono::milliseconds(50));
    server->close();
    setRxStatus(ConnectionStatus::TERMINATED);
}